

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::PackedStruct::PackedStruct
          (PackedStruct *this,string *struct_name,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *attributes)

{
  bool bVar1;
  reference __t;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_unsigned_int>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_unsigned_int>_> *p_Var3;
  undefined1 auStack_88 [8];
  PackedStructFieldDef def;
  type *size;
  type *name;
  __normal_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_38;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range1;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *attributes_local;
  string *struct_name_local;
  PackedStruct *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)struct_name);
  std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::vector
            (&this->attributes);
  this->external = false;
  __end1 = std::
           vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::begin(attributes);
  local_38._M_current =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        *)std::
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::end(attributes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_38);
    if (!bVar1) break;
    __t = __gnu_cxx::
          __normal_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          ::operator*(&__end1);
    p_Var2 = std::get<0ul,std::__cxx11::string,unsigned_int>(__t);
    p_Var3 = std::get<1ul,std::__cxx11::string,unsigned_int>(__t);
    def.name.field_2._8_8_ = 0;
    def.width = 0;
    def.signed_ = false;
    def._37_3_ = 0;
    def.name._M_string_length = 0;
    def.name.field_2._M_allocated_capacity = 0;
    auStack_88 = (undefined1  [8])0x0;
    def.name._M_dataplus = (_Alloc_hider)0x0;
    def.name._1_7_ = 0;
    PackedStructFieldDef::PackedStructFieldDef((PackedStructFieldDef *)auStack_88);
    def.name.field_2._M_local_buf[0xc] = 0;
    std::__cxx11::string::operator=((string *)auStack_88,(string *)p_Var2);
    def.name.field_2._8_4_ = *p_Var3;
    std::vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>>::
    emplace_back<kratos::PackedStructFieldDef&>
              ((vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>> *)
               &this->attributes,(PackedStructFieldDef *)auStack_88);
    PackedStructFieldDef::~PackedStructFieldDef((PackedStructFieldDef *)auStack_88);
    __gnu_cxx::
    __normal_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

PackedStruct::PackedStruct(std::string struct_name,
                           const std::vector<std::tuple<std::string, uint32_t>> &attributes)
    : struct_name(std::move(struct_name)) {
    for (auto const &[name, size] : attributes) {
        auto def = PackedStructFieldDef();
        def.signed_ = false;
        def.name = name;
        def.width = size;
        this->attributes.emplace_back(def);
    }
}